

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

mir_size_t raw_type_size(c2m_ctx_t c2m_ctx,type *type)

{
  mir_size_t mVar1;
  
  if (type->raw_size == 0xffffffffffffffff) {
    set_type_layout(c2m_ctx,type);
  }
  mVar1 = type->raw_size;
  if (c2m_ctx->n_errors == 0) {
    if (mVar1 == 0xffffffffffffffff) {
      __assert_fail("type->raw_size != MIR_SIZE_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x147,"mir_size_t raw_type_size(c2m_ctx_t, struct type *)");
    }
  }
  else if (mVar1 == 0xffffffffffffffff) {
    type->raw_size = 0;
    type->align = 1;
    mVar1 = 0;
  }
  return mVar1;
}

Assistant:

static mir_size_t raw_type_size (c2m_ctx_t c2m_ctx, struct type *type) {
  if (type->raw_size == MIR_SIZE_MAX) set_type_layout (c2m_ctx, type);
  if (n_errors != 0 && type->raw_size == MIR_SIZE_MAX) {
    /* Use safe values for programs with errors: */
    type->raw_size = 0;
    type->align = 1;
  }
  assert (type->raw_size != MIR_SIZE_MAX);
  return type->raw_size;
}